

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemCopy(Mem *pTo,Mem *pFrom)

{
  ushort uVar1;
  u16 uVar2;
  u8 uVar3;
  u8 uVar4;
  ushort uVar5;
  int iVar6;
  
  if ((pTo->flags & 0x2460) != 0) {
    vdbeMemClearExternAndSetNull(pTo);
  }
  uVar2 = pFrom->flags;
  uVar3 = pFrom->enc;
  uVar4 = pFrom->eSubtype;
  iVar6 = pFrom->n;
  pTo->u = pFrom->u;
  pTo->flags = uVar2;
  pTo->enc = uVar3;
  pTo->eSubtype = uVar4;
  pTo->n = iVar6;
  pTo->z = pFrom->z;
  uVar1 = pTo->flags;
  uVar5 = uVar1 & 0xfbff;
  pTo->flags = uVar5;
  if (((uVar1 & 0x12) != 0) && ((pFrom->flags & 0x800) == 0)) {
    pTo->flags = uVar5 | 0x1000;
    iVar6 = sqlite3VdbeMemMakeWriteable(pTo);
    return iVar6;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCopy(Mem *pTo, const Mem *pFrom){
  int rc = SQLITE_OK;

  assert( (pFrom->flags & MEM_RowSet)==0 );
  if( VdbeMemDynamic(pTo) ) vdbeMemClearExternAndSetNull(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->flags &= ~MEM_Dyn;
  if( pTo->flags&(MEM_Str|MEM_Blob) ){
    if( 0==(pFrom->flags&MEM_Static) ){
      pTo->flags |= MEM_Ephem;
      rc = sqlite3VdbeMemMakeWriteable(pTo);
    }
  }

  return rc;
}